

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpElementDecl(xmlOutputBufferPtr buf,xmlElementPtr elem)

{
  xmlElementTypeVal xVar1;
  xmlElementPtr elem_local;
  xmlOutputBufferPtr buf_local;
  
  xmlOutputBufferWrite(buf,10,"<!ELEMENT ");
  if (elem->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)elem->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)elem->name);
  xmlOutputBufferWrite(buf,1," ");
  xVar1 = elem->etype;
  if (xVar1 == XML_ELEMENT_TYPE_EMPTY) {
    xmlOutputBufferWrite(buf,5,"EMPTY");
  }
  else if (xVar1 == XML_ELEMENT_TYPE_ANY) {
    xmlOutputBufferWrite(buf,3,"ANY");
  }
  else if (xVar1 - XML_ELEMENT_TYPE_MIXED < 2) {
    xmlBufDumpElementContent(buf,elem->content);
  }
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpElementDecl(xmlOutputBufferPtr buf, xmlElementPtr elem) {
    xmlOutputBufferWrite(buf, 10, "<!ELEMENT ");
    if (elem->prefix != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) elem->prefix);
        xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) elem->name);
    xmlOutputBufferWrite(buf, 1, " ");

    switch (elem->etype) {
	case XML_ELEMENT_TYPE_EMPTY:
	    xmlOutputBufferWrite(buf, 5, "EMPTY");
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    xmlOutputBufferWrite(buf, 3, "ANY");
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	case XML_ELEMENT_TYPE_ELEMENT:
	    xmlBufDumpElementContent(buf, elem->content);
	    break;
        default:
            /* assert(0); */
            break;
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}